

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::erase
          (iterator *__return_storage_ptr__,
          Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,iterator pos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_type *pvVar2;
  pointer pcVar3;
  iterator it;
  Node *pNVar4;
  InnerMap *pIVar5;
  size_type sVar6;
  iterator i;
  
  if ((this->arena_ == (Arena *)0x0) &&
     (pvVar2 = ((pos.it_.node_)->kv).v_, pvVar2 != (value_type *)0x0)) {
    pcVar3 = (pvVar2->second)._M_dataplus._M_p;
    paVar1 = &(pvVar2->second).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    operator_delete(pvVar2,0x28);
  }
  sVar6 = pos.it_.bucket_index_;
  pIVar5 = pos.it_.m_;
  pNVar4 = pos.it_.node_;
  InnerMap::
  iterator_base<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  ::operator++(&pos.it_);
  it.m_ = pIVar5;
  it.node_ = pNVar4;
  it.bucket_index_ = sVar6;
  InnerMap::erase(this->elements_,it);
  (__return_storage_ptr__->it_).bucket_index_ = pos.it_.bucket_index_;
  (__return_storage_ptr__->it_).node_ = pos.it_.node_;
  (__return_storage_ptr__->it_).m_ = pos.it_.m_;
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) {
    if (arena_ == NULL) delete pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    return pos;
  }